

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlb_helper.c
# Opt level: O3

_Bool arm_cpu_tlb_fill_aarch64
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  uc_struct_conflict7 *puVar1;
  ulong uVar2;
  _Bool _Var3;
  ARMMMUIdx AVar4;
  MemTxAttrs attrs;
  int prot;
  hwaddr phys_addr;
  target_ulong page_size;
  ARMMMUFaultInfo_conflict1 fi;
  
  puVar1 = cs->uc;
  attrs = (MemTxAttrs)0x0;
  fi.level = 0;
  fi.domain = 0;
  fi.stage2 = false;
  fi.s1ptw = false;
  fi.ea = false;
  fi._27_5_ = 0;
  fi.type = ARMFault_None;
  fi._4_4_ = 0;
  fi.s2addr = 0;
  AVar4 = ARMMMUIdx_MUser;
  if ((*(uint *)(cs[1].tb_jmp_cache + 0xa11) >> 9 & 1) == 0) {
    AVar4 = ARMMMUIdx_E10_0;
  }
  _Var3 = get_phys_addr_aarch64
                    ((CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b),address,access_type,
                     AVar4 | mmu_idx,&phys_addr,&attrs,&prot,&page_size,&fi,(ARMCacheAttrs *)0x0);
  if (_Var3) {
    if (!probe) {
      cpu_restore_state_aarch64(cs,retaddr,true);
      arm_deliver_fault((ARMCPU_conflict1 *)cs,address,access_type,mmu_idx,&fi);
    }
  }
  else {
    uVar2 = *(ulong *)&puVar1->init_target_page->mask;
    if ((ulong)(long)-(int)uVar2 <= page_size) {
      phys_addr = phys_addr & uVar2;
      address = address & uVar2;
    }
    tlb_set_page_with_attrs_aarch64(cs,address,phys_addr,attrs,prot,mmu_idx,page_size);
  }
  return !_Var3;
}

Assistant:

bool arm_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    struct uc_struct *uc = cs->uc;
    ARMCPU *cpu = ARM_CPU(cs);

    hwaddr phys_addr;
    target_ulong page_size;
    int prot, ret;
    MemTxAttrs attrs = { 0 };
    ARMMMUFaultInfo fi = { 0 };

    /*
     * Walk the page table and (if the mapping exists) add the page
     * to the TLB.  On success, return true.  Otherwise, if probing,
     * return false.  Otherwise populate fsr with ARM DFSR/IFSR fault
     * register format, and signal the fault.
     */
    ret = get_phys_addr(&cpu->env, address, access_type,
                        core_to_arm_mmu_idx(&cpu->env, mmu_idx),
                        &phys_addr, &attrs, &prot, &page_size, &fi, NULL);
    if (likely(!ret)) {
        /*
         * Map a single [sub]page. Regions smaller than our declared
         * target page size are handled specially, so for those we
         * pass in the exact addresses.
         */
        if (page_size >= TARGET_PAGE_SIZE) {
            phys_addr &= TARGET_PAGE_MASK;
            address &= TARGET_PAGE_MASK;
        }
        tlb_set_page_with_attrs(cs, address, phys_addr, attrs,
                                prot, mmu_idx, page_size);
        return true;
    } else if (probe) {
        return false;
    } else {
        /* now we have a real cpu fault */
        cpu_restore_state(cs, retaddr, true);
        arm_deliver_fault(cpu, address, access_type, mmu_idx, &fi);
    }
}